

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdrIncr.c
# Opt level: O2

int IPdr_ManCheckCubeReduce(Pdr_Man_t *p,Vec_Ptr_t *vClauses,Pdr_Set_t *pCube,int nConfLimit)

{
  uint *puVar1;
  lit *begin;
  Pdr_Man_t *p_00;
  int iVar2;
  int iVar3;
  uint uVar4;
  ulong uVar5;
  sat_solver *s;
  abctime aVar6;
  Aig_Obj_t *pObj;
  undefined4 extraout_var;
  Pdr_Set_t *pPVar7;
  Vec_Int_t *pVVar8;
  Vec_Ptr_t *pVVar9;
  void **__dest;
  void *__s;
  abctime time;
  abctime time_00;
  char *pcVar10;
  int Var;
  size_t __size;
  uint i;
  ulong uVar11;
  int Lit;
  ulong local_58;
  Vec_Int_t *local_50;
  int local_44;
  undefined8 local_40;
  Pdr_Man_t *local_38;
  
  uVar5 = Abc_Clock();
  pVVar9 = p->vSolvers;
  s = (sat_solver *)Vec_PtrEntry(pVVar9,1);
  iVar2 = (int)pVVar9;
  if (pCube == (Pdr_Set_t *)0x0) {
    local_44 = nConfLimit;
    pObj = (Aig_Obj_t *)Vec_PtrEntry(p->pAig->vCos,p->iOutCur);
    iVar2 = Pdr_ObjSatVar(p,1,2,pObj);
    Lit = Abc_Var2Lit(iVar2,0);
    iVar2 = sat_solver_addclause(s,&Lit,(lit *)&local_58);
    if (iVar2 != 1) {
      __assert_fail("RetValue == 1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/pdr/pdrIncr.c"
                    ,0x385,"int IPdr_ManCheckCubeReduce(Pdr_Man_t *, Vec_Ptr_t *, Pdr_Set_t *, int)"
                   );
    }
    local_50 = Vec_IntStart(vClauses->nSize);
    iVar2 = Pdr_ManFreeVar(p,1);
    local_40 = CONCAT44(extraout_var,iVar2);
    for (iVar2 = 1; iVar3 = vClauses->nSize, iVar2 < iVar3; iVar2 = iVar2 + 1) {
      Pdr_ManFreeVar(p,1);
    }
    local_58 = uVar5;
    local_38 = p;
    for (iVar2 = 0; p_00 = local_38, uVar5 = local_58, iVar2 < iVar3; iVar2 = iVar2 + 1) {
      pPVar7 = (Pdr_Set_t *)Vec_PtrEntry(vClauses,iVar2);
      pVVar8 = Pdr_ManCubeToLits(p_00,1,pPVar7,1,0);
      Var = (int)local_40 + iVar2;
      Lit = Abc_Var2Lit(Var,1);
      Vec_IntPush(pVVar8,Lit);
      iVar3 = sat_solver_addclause(s,pVVar8->pArray,pVVar8->pArray + pVVar8->nSize);
      if (iVar3 != 1) {
        __assert_fail("RetValue == 1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/pdr/pdrIncr.c"
                      ,0x392,
                      "int IPdr_ManCheckCubeReduce(Pdr_Man_t *, Vec_Ptr_t *, Pdr_Set_t *, int)");
      }
      iVar3 = Abc_Var2Lit(Var,0);
      Vec_IntWriteEntry(local_50,iVar2,iVar3);
      iVar3 = vClauses->nSize;
    }
    if ((s->qtail != s->qhead) && (iVar2 = sat_solver_simplify(s), iVar2 == 0)) {
      __assert_fail("RetValue != 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satSolver.h"
                    ,0x102,"void sat_solver_compress(sat_solver *)");
    }
    pVVar8 = local_50;
    begin = local_50->pArray;
    iVar3 = sat_solver_solve(s,begin,begin + local_50->nSize,(long)local_44,0,0,0);
    free(begin);
    free(pVVar8);
    iVar2 = (int)pVVar8;
    if (iVar3 == 0) {
      return -1;
    }
    if (iVar3 == -1) {
      local_50 = (Vec_Int_t *)(s->conf_final).ptr;
      uVar4 = (s->conf_final).size;
      pcVar10 = "UNSAT at the last frame. nCores = %d (out of %d).";
      __dest = (void **)0x0;
      Abc_Print(iVar2,"UNSAT at the last frame. nCores = %d (out of %d).",(ulong)uVar4,
                (ulong)(uint)vClauses->nSize);
      aVar6 = Abc_Clock();
      Abc_PrintTime((int)aVar6 - (int)uVar5,pcVar10,time_00);
      pVVar9 = (Vec_Ptr_t *)malloc(0x10);
      local_58 = (ulong)vClauses->nSize;
      pVVar9->nSize = vClauses->nSize;
      iVar2 = vClauses->nCap;
      pVVar9->nCap = iVar2;
      if ((long)iVar2 != 0) {
        __dest = (void **)malloc((long)iVar2 << 3);
      }
      uVar5 = local_58;
      pVVar9->pArray = __dest;
      memcpy(__dest,vClauses->pArray,local_58 * 8);
      uVar11 = 0;
      iVar2 = (((int)uVar5 >> 5) + 1) - (uint)((uVar5 & 0x1f) == 0);
      if (iVar2 == 0) {
        __size = 0;
        __s = (void *)0x0;
      }
      else {
        __size = (long)iVar2 << 2;
        __s = malloc(__size);
      }
      memset(__s,0,__size);
      vClauses->nSize = 0;
      uVar5 = (ulong)uVar4;
      if ((int)uVar4 < 1) {
        uVar5 = uVar11;
      }
      while( true ) {
        if (uVar5 == uVar11) {
          uVar5 = 0;
          uVar4 = (uint)local_58;
          if ((int)(uint)local_58 < 1) {
            uVar4 = 0;
          }
          uVar11 = (ulong)(uint)(iVar2 * 0x20);
          if (iVar2 * 0x20 < 1) {
            uVar11 = uVar5;
          }
          while( true ) {
            i = (uint)uVar5;
            if (uVar4 == i) {
              Vec_PtrFree(pVVar9);
              free(__s);
              return 1;
            }
            pPVar7 = (Pdr_Set_t *)Vec_PtrEntry(pVVar9,i);
            if ((uint)uVar11 == i) break;
            if ((*(uint *)((long)__s + (uVar5 >> 5) * 4) >> (i & 0x1f) & 1) == 0) {
              Pdr_SetDeref(pPVar7);
            }
            else {
              Vec_PtrPush(vClauses,pPVar7);
            }
            uVar5 = (ulong)(i + 1);
          }
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecBit.h"
                        ,0x121,"int Vec_BitEntry(Vec_Bit_t *, int)");
        }
        iVar3 = Abc_Lit2Var(*(int *)((long)local_50 + uVar11 * 4));
        uVar4 = iVar3 - (int)local_40;
        if (((int)uVar4 < 0) || (iVar2 * 0x20 <= (int)uVar4)) break;
        puVar1 = (uint *)((long)__s + (ulong)(uVar4 >> 5) * 4);
        *puVar1 = *puVar1 | 1 << ((byte)uVar4 & 0x1f);
        uVar11 = uVar11 + 1;
      }
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecBit.h"
                    ,0x132,"void Vec_BitWriteEntry(Vec_Bit_t *, int, int)");
    }
  }
  pcVar10 = "SAT at the last frame.";
  Abc_Print(iVar2,"SAT at the last frame.");
  aVar6 = Abc_Clock();
  Abc_PrintTime((int)aVar6 - (int)uVar5,pcVar10,time);
  return 0;
}

Assistant:

int IPdr_ManCheckCubeReduce( Pdr_Man_t * p, Vec_Ptr_t * vClauses, Pdr_Set_t * pCube, int nConfLimit )
{ 
    sat_solver * pSat;
    Vec_Int_t * vLits, * vLitsA;
    int Lit, RetValue = l_True;
    int i;
    Pdr_Set_t * pCla;
    int iActVar = 0;
    abctime clk = Abc_Clock();

    pSat = Pdr_ManSolver( p, 1 );

    if ( pCube == NULL ) // solve the property
    {
        Lit = Abc_Var2Lit( Pdr_ObjSatVar(p, 1, 2, Aig_ManCo(p->pAig, p->iOutCur)), 0 ); // pos literal (property fails)
        RetValue = sat_solver_addclause( pSat, &Lit, &Lit+1 );
        assert( RetValue == 1 );

        vLitsA = Vec_IntStart( Vec_PtrSize( vClauses ) );
        iActVar = Pdr_ManFreeVar( p, 1 );
        for ( i = 1; i < Vec_PtrSize( vClauses ); ++i )
            Pdr_ManFreeVar( p, 1 );
        Vec_PtrForEachEntry( Pdr_Set_t *, vClauses, pCla, i )
        {
            vLits = Pdr_ManCubeToLits( p, 1, pCla, 1, 0 );
            Lit = Abc_Var2Lit( iActVar + i, 1 );
            Vec_IntPush( vLits, Lit );

            RetValue = sat_solver_addclause( pSat, Vec_IntArray(vLits), Vec_IntArray(vLits) + Vec_IntSize(vLits) );
            assert( RetValue == 1 );
            Vec_IntWriteEntry( vLitsA, i, Abc_Var2Lit( iActVar + i, 0 )  );
        }
        sat_solver_compress( pSat );

        // solve 
        RetValue = sat_solver_solve( pSat, Vec_IntArray(vLitsA), Vec_IntArray(vLitsA) + Vec_IntSize(vLitsA), nConfLimit, 0, 0, 0 );
        Vec_IntFree( vLitsA );

        if ( RetValue == l_Undef )
            return -1;
    }

    assert( RetValue != l_Undef );
    if ( RetValue == l_False ) // UNSAT
    {
        int ncorelits, *pcorelits;
        Vec_Ptr_t * vTemp = NULL;
        Vec_Bit_t * vMark = NULL;

        ncorelits = sat_solver_final(pSat, &pcorelits);
        Abc_Print( 1, "UNSAT at the last frame. nCores = %d (out of %d).", ncorelits, Vec_PtrSize( vClauses ) );
        Abc_PrintTime( 1, "    Time", Abc_Clock() - clk );

        vTemp = Vec_PtrDup( vClauses );
        vMark = Vec_BitStart( Vec_PtrSize( vClauses) );
        Vec_PtrClear( vClauses );
        for ( i = 0; i < ncorelits; ++i )
        {
            //Abc_Print( 1, "Core[%d] = lit(%d) = var(%d) = %d-th set\n", i, pcorelits[i], Abc_Lit2Var(pcorelits[i]), Abc_Lit2Var(pcorelits[i]) - iActVar );
            Vec_BitWriteEntry( vMark, Abc_Lit2Var( pcorelits[i] ) - iActVar, 1 );
        }
        
        Vec_PtrForEachEntry( Pdr_Set_t *, vTemp, pCla, i )
        {
            if ( Vec_BitEntry( vMark, i ) )
            { 
                Vec_PtrPush( vClauses, pCla );
                continue;
            }
            Pdr_SetDeref( pCla );
        }

        Vec_PtrFree( vTemp );
        Vec_BitFree( vMark );
        RetValue = 1;
    }
    else // SAT
    {
        Abc_Print( 1, "SAT at the last frame." );
        Abc_PrintTime( 1, "    Time", Abc_Clock() - clk );
        RetValue = 0;
    }

    return RetValue;
}